

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_validator_options.cpp
# Opt level: O2

void spvValidatorOptionsSetUniversalLimit
               (spv_validator_options options,spv_validator_limit limit_type,uint32_t limit)

{
  if (options == (spv_validator_options)0x0) {
    __assert_fail("options && \"Validator options object may not be Null\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/spirv_validator_options.cpp"
                  ,0x3e,
                  "void spvValidatorOptionsSetUniversalLimit(spv_validator_options, spv_validator_limit, uint32_t)"
                 );
  }
  switch(limit_type) {
  case spv_validator_limit_max_struct_members:
    break;
  case spv_validator_limit_max_struct_depth:
    options = (spv_validator_options)&(options->universal_limits_).max_struct_depth;
    break;
  case spv_validator_limit_max_local_variables:
    options = (spv_validator_options)&(options->universal_limits_).max_local_variables;
    break;
  case spv_validator_limit_max_global_variables:
    options = (spv_validator_options)&(options->universal_limits_).max_global_variables;
    break;
  case spv_validator_limit_max_switch_branches:
    options = (spv_validator_options)&(options->universal_limits_).max_switch_branches;
    break;
  case spv_validator_limit_max_function_args:
    options = (spv_validator_options)&(options->universal_limits_).max_function_args;
    break;
  case spv_validator_limit_max_control_flow_nesting_depth:
    options = (spv_validator_options)&(options->universal_limits_).max_control_flow_nesting_depth;
    break;
  case spv_validator_limit_max_access_chain_indexes:
    options = (spv_validator_options)&(options->universal_limits_).max_access_chain_indexes;
    break;
  case spv_validator_limit_max_id_bound:
    options = (spv_validator_options)&(options->universal_limits_).max_id_bound;
    break;
  default:
    goto switchD_001e3af1_default;
  }
  (options->universal_limits_).max_struct_members = limit;
switchD_001e3af1_default:
  return;
}

Assistant:

void spvValidatorOptionsSetUniversalLimit(spv_validator_options options,
                                          spv_validator_limit limit_type,
                                          uint32_t limit) {
  assert(options && "Validator options object may not be Null");
  switch (limit_type) {
#define LIMIT(TYPE, FIELD)                    \
  case TYPE:                                  \
    options->universal_limits_.FIELD = limit; \
    break;
    LIMIT(spv_validator_limit_max_struct_members, max_struct_members)
    LIMIT(spv_validator_limit_max_struct_depth, max_struct_depth)
    LIMIT(spv_validator_limit_max_local_variables, max_local_variables)
    LIMIT(spv_validator_limit_max_global_variables, max_global_variables)
    LIMIT(spv_validator_limit_max_switch_branches, max_switch_branches)
    LIMIT(spv_validator_limit_max_function_args, max_function_args)
    LIMIT(spv_validator_limit_max_control_flow_nesting_depth,
          max_control_flow_nesting_depth)
    LIMIT(spv_validator_limit_max_access_chain_indexes,
          max_access_chain_indexes)
    LIMIT(spv_validator_limit_max_id_bound, max_id_bound)
#undef LIMIT
  }
}